

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

void pythonEndElement(void *user_data,xmlChar *name)

{
  int iVar1;
  PyObject *op;
  long lVar2;
  char *pcVar3;
  
  iVar1 = PyObject_HasAttrString(user_data,"endElement");
  if (iVar1 == 0) {
    iVar1 = PyObject_HasAttrString(user_data,"end");
    if (iVar1 == 0) {
      return;
    }
    pcVar3 = "end";
  }
  else {
    pcVar3 = "endElement";
  }
  op = (PyObject *)_PyObject_CallMethod_SizeT(user_data,pcVar3,"s",name);
  lVar2 = PyErr_Occurred();
  if (lVar2 != 0) {
    PyErr_Print();
  }
  _Py_XDECREF(op);
  return;
}

Assistant:

static void
pythonEndElement(void *user_data, const xmlChar * name)
{
    PyObject *handler;
    PyObject *result;

#ifdef DEBUG_SAX
    printf("pythonEndElement(%s) called\n", name);
#endif
    handler = (PyObject *) user_data;
    if (PyObject_HasAttrString(handler, (char *) "endElement")) {
        result = PyObject_CallMethod(handler, (char *) "endElement",
                                     (char *) "s", name);
        if (PyErr_Occurred())
            PyErr_Print();
        Py_XDECREF(result);
    } else if (PyObject_HasAttrString(handler, (char *) "end")) {
        result = PyObject_CallMethod(handler, (char *) "end",
                                     (char *) "s", name);
        if (PyErr_Occurred())
            PyErr_Print();
        Py_XDECREF(result);
    }
}